

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O1

int Gia_ManFactorSop(Gia_Man_t *p,Vec_Int_t *vCiObjIds,Vec_Str_t *vSop,int fHash)

{
  Vec_Int_t *pVVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Gia_Man_t *p_00;
  Gia_Obj_t *pFanout;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  Gia_Obj_t *pGVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  
  p_00 = Abc_SopSynthesizeOne(vSop->pArray,1);
  pVVar1 = p_00->vCis;
  uVar3 = pVVar1->nSize;
  uVar13 = uVar3 - p_00->nRegs;
  uVar15 = vCiObjIds->nSize;
  if (uVar13 != uVar15) {
    __assert_fail("Gia_ManPiNum(pMan) == Vec_IntSize(vCiObjIds)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/AbcGlucose.cpp"
                  ,0x42b,"int Gia_ManFactorSop(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *, int)");
  }
  pGVar10 = p_00->pObjs;
  pGVar10->Value = 0;
  if (0 < (int)uVar13) {
    uVar12 = 0;
    uVar6 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar6 = uVar12;
    }
    uVar11 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar11 = uVar12;
    }
    do {
      if (uVar6 == uVar12) goto LAB_005b3edc;
      iVar5 = pVVar1->pArray[uVar12];
      if (((long)iVar5 < 0) || (p_00->nObjs <= iVar5)) goto LAB_005b3ebd;
      if (pGVar10 == (Gia_Obj_t *)0x0) break;
      if (uVar11 == uVar12) goto LAB_005b3edc;
      if (vCiObjIds->pArray[uVar12] < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      pGVar10[iVar5].Value = vCiObjIds->pArray[uVar12] * 2;
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
  }
  iVar5 = p_00->nObjs;
  if (0 < iVar5) {
    pGVar10 = p_00->pObjs;
    if (pGVar10 != (Gia_Obj_t *)0x0) {
      lVar14 = 0;
      do {
        uVar6 = *(ulong *)pGVar10;
        if ((uVar6 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar6) {
          uVar3 = pGVar10[-(uVar6 & 0x1fffffff)].Value;
          uVar15 = (uint)(uVar6 >> 0x20);
          if (fHash == 0) {
            if (((int)uVar3 < 0) ||
               (uVar13 = pGVar10[-(ulong)(uVar15 & 0x1fffffff)].Value, (int)uVar13 < 0))
            goto LAB_005b3f39;
            pFanout = Gia_ManAppendObj(p);
            uVar7 = uVar3 >> 1;
            iVar5 = p->nObjs;
            if (iVar5 <= (int)uVar7) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
            uVar4 = uVar13 >> 1;
            if (iVar5 <= (int)uVar4) {
              __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
            if ((uVar7 == uVar4) && (p->fGiaSimple == 0)) {
              __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
            uVar3 = uVar3 ^ (uint)(uVar6 >> 0x1d) & 1;
            uVar13 = uVar13 ^ uVar15 >> 0x1d & 1;
            iVar9 = (int)pFanout;
            if ((int)uVar3 < (int)uVar13) {
              pGVar2 = p->pObjs;
              if ((pFanout < pGVar2) || (pGVar2 + iVar5 <= pFanout)) goto LAB_005b3f1a;
              uVar6 = *(ulong *)pFanout;
              uVar12 = (ulong)((uVar3 & 1) << 0x1d |
                              ((uint)(iVar9 - (int)pGVar2) >> 2) * -0x55555555 - uVar7 & 0x1fffffff)
              ;
              *(ulong *)pFanout = uVar12 | uVar6 & 0xffffffffc0000000;
              pGVar2 = p->pObjs;
              if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) goto LAB_005b3f1a;
              uVar8 = (ulong)(((uint)(iVar9 - (int)pGVar2) >> 2) * -0x55555555 - uVar4 & 0x1fffffff)
                      << 0x20;
              *(ulong *)pFanout = uVar12 | uVar6 & 0xe0000000c0000000 | uVar8;
              uVar16 = (ulong)(uVar13 & 1) << 0x3d;
              uVar8 = uVar12 | uVar6 & 0xc0000000c0000000 | uVar8;
            }
            else {
              pGVar2 = p->pObjs;
              if ((pFanout < pGVar2) || (pGVar2 + iVar5 <= pFanout)) goto LAB_005b3f1a;
              uVar12 = (ulong)(((uint)(iVar9 - (int)pGVar2) >> 2) * -0x55555555 - uVar7 & 0x1fffffff
                              ) << 0x20;
              uVar6 = *(ulong *)pFanout;
              uVar11 = (ulong)(uVar3 & 1) << 0x3d;
              *(ulong *)pFanout = uVar11 | uVar6 & 0xc0000000ffffffff | uVar12;
              pGVar2 = p->pObjs;
              if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) goto LAB_005b3f1a;
              uVar8 = (ulong)(((uint)(iVar9 - (int)pGVar2) >> 2) * -0x55555555 - uVar4 & 0x1fffffff)
              ;
              *(ulong *)pFanout = uVar11 | uVar6 & 0xc0000000e0000000 | uVar12 | uVar8;
              uVar16 = (ulong)((uVar13 & 1) << 0x1d);
              uVar8 = uVar11 | uVar6 & 0xc0000000c0000000 | uVar12 | uVar8;
            }
            *(ulong *)pFanout = uVar8 | uVar16;
            if (p->pFanData != (int *)0x0) {
              Gia_ObjAddFanout(p,pFanout + -(uVar8 & 0x1fffffff),pFanout);
              Gia_ObjAddFanout(p,pFanout + -((ulong)*(uint *)&pFanout->field_0x4 & 0x1fffffff),
                               pFanout);
            }
            if (p->fSweeper != 0) {
              uVar12 = *(ulong *)pFanout & 0x1fffffff;
              uVar6 = *(ulong *)pFanout >> 0x20 & 0x1fffffff;
              uVar11 = 0x4000000000000000;
              if (((uint)*(ulong *)(pFanout + -uVar12) >> 0x1e & 1) == 0) {
                uVar11 = 0x40000000;
              }
              *(ulong *)(pFanout + -uVar12) = uVar11 | *(ulong *)(pFanout + -uVar12);
              uVar11 = *(ulong *)(pFanout + -uVar6);
              uVar8 = 0x4000000000000000;
              if (((uint)uVar11 >> 0x1e & 1) == 0) {
                uVar8 = 0x40000000;
              }
              *(ulong *)(pFanout + -uVar6) = uVar8 | uVar11;
              uVar6 = *(ulong *)pFanout;
              *(ulong *)pFanout =
                   uVar6 & 0x7fffffffffffffff |
                   (ulong)(((uint)(uVar6 >> 0x3d) ^ (uint)(uVar11 >> 0x3f)) &
                          ((uint)((ulong)*(undefined8 *)(pFanout + -uVar12) >> 0x3f) ^
                          (uint)(uVar6 >> 0x1d) & 7)) << 0x3f;
            }
            if (p->fBuiltInSim != 0) {
              uVar6 = *(ulong *)pFanout;
              *(ulong *)pFanout =
                   uVar6 & 0x7fffffffffffffff |
                   (ulong)(((uint)(uVar6 >> 0x3d) ^
                           (uint)((ulong)*(undefined8 *)(pFanout + -(uVar6 >> 0x20 & 0x1fffffff)) >>
                                 0x3f)) &
                          ((uint)((ulong)*(undefined8 *)(pFanout + -(uVar6 & 0x1fffffff)) >> 0x3f) ^
                          (uint)(uVar6 >> 0x1d) & 7)) << 0x3f;
              pGVar2 = p->pObjs;
              if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) goto LAB_005b3f1a;
              Gia_ManBuiltInSimPerform
                        (p,(int)((ulong)((long)pFanout - (long)pGVar2) >> 2) * -0x55555555);
            }
            if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
              Gia_ManQuantSetSuppAnd(p,pFanout);
            }
            pGVar2 = p->pObjs;
            if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) {
LAB_005b3f1a:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar3 = (int)((ulong)((long)pFanout - (long)pGVar2) >> 2) * 0x55555556;
          }
          else {
            if (((int)uVar3 < 0) || ((int)pGVar10[-(ulong)(uVar15 & 0x1fffffff)].Value < 0))
            goto LAB_005b3f39;
            uVar3 = Gia_ManHashAnd(p,uVar3 ^ (uint)(uVar6 >> 0x1d) & 1,
                                   pGVar10[-(ulong)(uVar15 & 0x1fffffff)].Value ^ uVar15 >> 0x1d & 1
                                  );
          }
          pGVar10->Value = uVar3;
        }
        lVar14 = lVar14 + 1;
        iVar5 = p_00->nObjs;
      } while ((lVar14 < iVar5) && (pGVar10 = p_00->pObjs + lVar14, p_00->pObjs != (Gia_Obj_t *)0x0)
              );
    }
  }
  iVar9 = p_00->vCos->nSize;
  if (iVar9 <= p_00->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar9 < 1) {
LAB_005b3edc:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar9 = *p_00->vCos->pArray;
  if (((long)iVar9 < 0) || (iVar5 <= iVar9)) {
LAB_005b3ebd:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar15 = (uint)*(undefined8 *)(p_00->pObjs + iVar9);
  uVar3 = (p_00->pObjs + iVar9)[-(ulong)(uVar15 & 0x1fffffff)].Value;
  if (-1 < (int)uVar3) {
    Gia_ManStop(p_00);
    return uVar15 >> 0x1d & 1 ^ uVar3;
  }
LAB_005b3f39:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x132,"int Abc_LitNotCond(int, int)");
}

Assistant:

int Gia_ManFactorSop( Gia_Man_t * p, Vec_Int_t * vCiObjIds, Vec_Str_t * vSop, int fHash )
{
    extern Gia_Man_t * Abc_SopSynthesizeOne( char * pSop, int fClp );
    Gia_Man_t * pMan = Abc_SopSynthesizeOne( Vec_StrArray(vSop), 1 );
    Gia_Obj_t * pObj; int i, Result;
    assert( Gia_ManPiNum(pMan) == Vec_IntSize(vCiObjIds) );
    Gia_ManConst0(pMan)->Value = 0;
    Gia_ManForEachPi( pMan, pObj, i )
        pObj->Value = Abc_Var2Lit( Vec_IntEntry(vCiObjIds, i), 0 );
    Gia_ManForEachAnd( pMan, pObj, i )
        if ( fHash )
            pObj->Value = Gia_ManHashAnd( p, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendAnd( p, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    pObj = Gia_ManPo(pMan, 0);
    Result = Gia_ObjFanin0Copy(pObj);
    Gia_ManStop( pMan );
    return Result;
}